

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicsLinearization.cpp
# Opt level: O0

void __thiscall
iDynTree::ForwardDynamicsLinearizationInternalBuffers::ForwardDynamicsLinearizationInternalBuffers
          (ForwardDynamicsLinearizationInternalBuffers *this,Model *model)

{
  Model *in_stack_00000048;
  ForwardDynamicsLinearizationInternalBuffers *in_stack_00000050;
  size_t in_stack_ffffffffffffff98;
  LinkPositions *in_stack_ffffffffffffffa0;
  ArticulatedBodyAlgorithmInternalBuffers *in_stack_ffffffffffffffe0;
  
  ArticulatedBodyAlgorithmInternalBuffers::ArticulatedBodyAlgorithmInternalBuffers
            (in_stack_ffffffffffffffe0);
  std::
  vector<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
  ::vector((vector<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
            *)0x3c9edb);
  LinkPositions::LinkPositions(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
  ::vector((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
            *)0x3c9f0d);
  std::vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>::
  vector((vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
          *)0x3c9f23);
  std::
  vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
  ::vector((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
            *)0x3c9f39);
  std::
  vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
  ::vector((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
            *)0x3c9f4f);
  std::
  vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
  ::vector((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
            *)0x3c9f65);
  std::
  vector<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
  ::vector((vector<iDynTree::ArticulatedBodyAlgorithmInternalBuffers,_std::allocator<iDynTree::ArticulatedBodyAlgorithmInternalBuffers>_>
            *)0x3c9f7b);
  resize(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

ForwardDynamicsLinearizationInternalBuffers::ForwardDynamicsLinearizationInternalBuffers(const Model& model)
{
    resize(model);
}